

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::processInfeasibleVertices(HighsCliqueTable *this,HighsDomain *globaldom)

{
  CliqueVar CVar1;
  pointer pCVar2;
  pointer piVar3;
  Substitution SVar4;
  pointer puVar5;
  pointer pHVar6;
  pointer pHVar7;
  CliqueVar CVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  CliqueVar v;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clq;
  CliqueVar local_7c;
  NodePtr local_78;
  NodePtr local_70;
  anon_class_24_3_e13e751c local_68;
  anon_class_24_3_389c80ea local_48;
  
  do {
    pCVar2 = (this->infeasvertexstack).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->infeasvertexstack).
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         ._M_impl.super__Vector_impl_data._M_start == pCVar2) || (globaldom->infeasible_ != false))
    {
      propagateAndCleanup(this,globaldom);
      return;
    }
    CVar1 = pCVar2[-1];
    local_7c = (CliqueVar)((int)CVar1 + 0x80000000);
    (this->infeasvertexstack).
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar2 + -1;
    piVar3 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = piVar3[(uint)CVar1 & 0x7fffffff];
    if (iVar10 != 0) {
      do {
        SVar4 = (this->substitutions).
                super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar10 + -1];
        local_7c = (CliqueVar)((uint)local_7c & 0x80000000 ^ 0x80000000 ^ (uint)SVar4.replace);
        iVar10 = *(int *)((long)piVar3 + ((ulong)SVar4 >> 0x1e & 0x1fffffffc));
      } while (iVar10 != 0);
    }
    uVar11 = (uint)local_7c & 0x7fffffff;
    local_78.ptrAndType =
         (uintptr_t)
         (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar11];
    local_70.ptrAndType =
         (uintptr_t)
         (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar11];
    HighsDomain::fixCol(globaldom,uVar11,(double)((uint)local_7c >> 0x1f),(Reason)0xfffffffe);
    iVar10 = 1;
    if (globaldom->infeasible_ == false) {
      if (((double)local_78.ptrAndType != (double)local_70.ptrAndType) ||
         (NAN((double)local_78.ptrAndType) || NAN((double)local_70.ptrAndType))) {
        this->nfixings = this->nfixings + 1;
      }
      puVar5 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar10 = 2;
      if (puVar5[(uint)local_7c & 0x7fffffff] == '\0') {
        puVar5[(uint)local_7c & 0x7fffffff] = '\x01';
        uVar11 = (int)local_7c << 1 | (uint)((int)local_7c < 0);
        pHVar6 = (this->invertedHashList).
                 super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70.ptrAndType = pHVar6[(int)uVar11].root.ptrAndType;
        pHVar6[(int)uVar11].root.ptrAndType = 0;
        pHVar7 = (this->invertedHashListSizeTwo).
                 super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_78.ptrAndType = pHVar7[(int)uVar11].root.ptrAndType;
        pHVar7[(int)uVar11].root.ptrAndType = 0;
        local_68.v = &local_7c;
        local_68.this = this;
        local_68.globaldom = globaldom;
        bVar9 = HighsHashTree<int,_int>::
                for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1535:39)_&,_0>
                          (local_70,&local_68);
        iVar10 = 1;
        if (!bVar9) {
          local_68.v = &local_7c;
          local_68.this = this;
          local_68.globaldom = globaldom;
          bVar9 = HighsHashTree<int,_void>::
                  for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1558:41)_&,_0>
                            (local_78,&local_68);
          CVar1 = local_7c;
          if (!bVar9) {
            pHVar6 = (this->invertedHashList).
                     super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            HighsHashTree<int,_int>::destroy_recurse(local_70);
            CVar8 = local_7c;
            uVar11 = (int)CVar1 << 1 | (uint)((int)((int)CVar1 + 0x80000000U) < 0);
            local_70.ptrAndType = pHVar6[(int)uVar11].root.ptrAndType;
            pHVar6[(int)uVar11].root.ptrAndType = 0;
            pHVar7 = (this->invertedHashListSizeTwo).
                     super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            HighsHashTree<int,_void>::destroy_recurse(local_78);
            uVar11 = (int)CVar8 << 1 | (uint)((int)((int)CVar8 + 0x80000000U) < 0);
            local_78.ptrAndType = pHVar7[(int)uVar11].root.ptrAndType;
            pHVar7[(int)uVar11].root.ptrAndType = 0;
            if (this->inPresolve == true) {
              local_68.this = this;
              HighsHashTree<int,_int>::
              for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1590:27)_&,_0>
                        (local_70,(anon_class_8_1_8991fb9c *)&local_68);
              iVar10 = 2;
            }
            else {
              local_68.this = this;
              HighsHashTree<int,_void>::
              for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1601:9)_&,_0>
                        (local_78,(anon_class_8_1_8991fb9c *)&local_68);
              local_68.this = (HighsCliqueTable *)0x0;
              local_68.v = (CliqueVar *)0x0;
              local_68.globaldom = (HighsDomain *)0x0;
              local_48.this = this;
              local_48.clq = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              *)&local_68;
              local_48.globaldom = globaldom;
              HighsHashTree<int,_int>::
              for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1605:25)_&,_0>
                        (local_70,&local_48);
              if (local_68.this != (HighsCliqueTable *)0x0) {
                operator_delete(local_68.this);
              }
              iVar10 = 0;
            }
          }
        }
        HighsHashTree<int,_void>::destroy_recurse(local_78);
        HighsHashTree<int,_int>::destroy_recurse(local_70);
      }
    }
  } while (iVar10 != 1);
  return;
}

Assistant:

void HighsCliqueTable::processInfeasibleVertices(HighsDomain& globaldom) {
  while (!infeasvertexstack.empty() && !globaldom.infeasible()) {
    CliqueVar v = infeasvertexstack.back().complement();
    infeasvertexstack.pop_back();

    resolveSubstitution(v);
    bool wasfixed = globaldom.isFixed(v.col);
    globaldom.fixCol(v.col, double(v.val));
    if (globaldom.infeasible()) return;
    if (!wasfixed) ++nfixings;
    if (colDeleted[v.col]) continue;
    colDeleted[v.col] = true;

    HighsHashTree<HighsInt, HighsInt> vHashLists =
        std::move(invertedHashList[v.index()]);
    HighsHashTree<HighsInt> vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.index()]);

    bool infeas = vHashLists.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    infeas = vHashListsSizeTwo.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    vHashLists = std::move(invertedHashList[v.complement().index()]);
    vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.complement().index()]);

    if (inPresolve) {
      // during presolve we only count the number of zeros within each clique
      // and only remove fully redundant cliques that are larger than two
      // in the process since during presolve a lot of cliques of size two
      // may be found by probing and will be deleted upon rebuild anyways
      vHashLists.for_each([&](HighsInt cliqueid) {
        cliques[cliqueid].numZeroFixed += 1;
        if (cliques[cliqueid].end - cliques[cliqueid].start -
                cliques[cliqueid].numZeroFixed <=
            1)
          removeClique(cliqueid);
      });
      continue;
    }

    vHashListsSizeTwo.for_each(
        [&](HighsInt cliqueid) { removeClique(cliqueid); });

    assert(cliquehitinds.empty());
    std::vector<CliqueVar> clq;
    vHashLists.for_each([&](HighsInt cliqueid) {
      // assert(cliqueentries[entry.value()].val == 1 - v.val);

      cliques[cliqueid].numZeroFixed += 1;
      if (cliques[cliqueid].end - cliques[cliqueid].start -
              cliques[cliqueid].numZeroFixed <=
          1) {
        removeClique(cliqueid);
      } else if (cliques[cliqueid].numZeroFixed >=
                 std::max(
                     HighsInt{10},
                     (cliques[cliqueid].end - cliques[cliqueid].start) >> 1)) {
        clq.assign(cliqueentries.begin() + cliques[cliqueid].start,
                   cliqueentries.begin() + cliques[cliqueid].end);

        auto computeNumDeleted = [&](const std::vector<CliqueVar>& clq) {
          HighsInt numDel = 0;
          for (CliqueVar x : clq) numDel += colDeleted[x.col];
          return numDel;
        };

        assert(computeNumDeleted(clq) == cliques[cliqueid].numZeroFixed);

        removeClique(cliqueid);
        clq.erase(std::remove_if(clq.begin(), clq.end(),
                                 [&](CliqueVar x) {
                                   return globaldom.isFixed(x.col) &&
                                          globaldom.col_lower_[x.col] ==
                                              1 - x.val;
                                 }),
                  clq.end());
        if (clq.size() > 1) doAddClique(clq.data(), clq.size());
      }
    });
  }

  propagateAndCleanup(globaldom);
}